

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_utils.cpp
# Opt level: O1

void crnlib::utils::copy_words(uint16 *pDst,uint16 *pSrc,uint num,bool endian_switch)

{
  undefined7 in_register_00000009;
  long lVar1;
  
  if ((int)CONCAT71(in_register_00000009,endian_switch) != 0) {
    if (num != 0) {
      lVar1 = 0;
      do {
        *(ushort *)((long)pDst + lVar1) =
             *(ushort *)((long)pSrc + lVar1) << 8 | *(ushort *)((long)pSrc + lVar1) >> 8;
        lVar1 = lVar1 + 2;
      } while ((ulong)num * 2 != lVar1);
    }
    return;
  }
  memcpy(pDst,pSrc,(ulong)(num * 2));
  return;
}

Assistant:

void copy_words(uint16* pDst, const uint16* pSrc, uint num, bool endian_switch) {
  if (!endian_switch)
    memcpy(pDst, pSrc, num << 1U);
  else {
    uint16* pDst_end = pDst + num;
    while (pDst != pDst_end)
      *pDst++ = swap16(*pSrc++);
  }
}